

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

timestamp_ns_t duckdb::Timestamp::TimestampNsFromEpochMillis(int64_t millis)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  timestamp_ns_t result;
  string local_38;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(millis,1000,(int64_t *)&result);
  if (bVar1) {
    return (timestamp_ns_t)(timestamp_ns_t)result.super_timestamp_t.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert Timestamp(US) to Timestamp(NS)",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_ns_t Timestamp::TimestampNsFromEpochMillis(int64_t millis) {
	D_ASSERT(Timestamp::IsFinite(timestamp_t(millis)));
	timestamp_ns_t result;
	if (!TryMultiplyOperator::Operation(millis, Interval::NANOS_PER_MICRO, result.value)) {
		throw ConversionException("Could not convert Timestamp(US) to Timestamp(NS)");
	}
	return result;
}